

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O1

int lua_getstack(lua_State *L,int level,lua_Debug *ar)

{
  int iVar1;
  CallInfo *pCVar2;
  int iVar3;
  CallInfo *pCVar4;
  bool bVar5;
  
  iVar1 = 0;
  if (-1 < level) {
    pCVar2 = L->ci;
    pCVar4 = &L->base_ci;
    bVar5 = pCVar2 != pCVar4;
    iVar3 = level;
    if (level != 0 && bVar5) {
      do {
        level = iVar3 + -1;
        pCVar2 = pCVar2->previous;
        bVar5 = pCVar2 != pCVar4;
        if (iVar3 < 2) break;
        iVar3 = level;
      } while (pCVar2 != pCVar4);
    }
    if ((bool)(level == 0 & bVar5)) {
      ar->i_ci = pCVar2;
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

LUA_API int lua_getstack (lua_State *L, int level, lua_Debug *ar) {
  int status;
  CallInfo *ci;
  if (level < 0) return 0;  /* invalid (negative) level */
  lua_lock(L);
  for (ci = L->ci; level > 0 && ci != &L->base_ci; ci = ci->previous)
    level--;
  if (level == 0 && ci != &L->base_ci) {  /* level found? */
    status = 1;
    ar->i_ci = ci;
  }
  else status = 0;  /* no such level */
  lua_unlock(L);
  return status;
}